

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.cpp
# Opt level: O0

ssize_t __thiscall VCXProjectWriter::write(VCXProjectWriter *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  XmlOutput *this_00;
  XmlOutput *v;
  XmlOutput *toTag;
  XmlOutput *ch;
  XmlOutput *o;
  XmlOutput *this_01;
  XmlOutput *name;
  undefined4 in_register_00000034;
  xml_output *this_02;
  long in_FS_OFFSET;
  QString *in_stack_fffffffffffff3f8;
  QStringList *in_stack_fffffffffffff400;
  QString *in_stack_fffffffffffff408;
  char *in_stack_fffffffffffff428;
  xml_output *in_stack_fffffffffffff438;
  XmlOutput *in_stack_fffffffffffff440;
  char *in_stack_fffffffffffff4a8;
  
  this_02 = (xml_output *)CONCAT44(in_register_00000034,__fd);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QString::QString(in_stack_fffffffffffff3f8,in_stack_fffffffffffff428);
  tag(in_stack_fffffffffffff408);
  this_00 = XmlOutput::operator<<(in_stack_fffffffffffff440,in_stack_fffffffffffff438);
  attrTagX(in_stack_fffffffffffff4a8,in_stack_fffffffffffff400,(char *)this_00);
  v = XmlOutput::operator<<(in_stack_fffffffffffff440,in_stack_fffffffffffff438);
  attrTagX(in_stack_fffffffffffff4a8,(QStringList *)v,(char *)this_00);
  toTag = XmlOutput::operator<<(in_stack_fffffffffffff440,in_stack_fffffffffffff438);
  attrTagT((char *)v,(triState)((ulong)this_00 >> 0x20));
  XmlOutput::operator<<(in_stack_fffffffffffff440,in_stack_fffffffffffff438);
  attrTagS((char *)this_00,(QString *)this_02);
  XmlOutput::operator<<(in_stack_fffffffffffff440,in_stack_fffffffffffff438);
  attrTagX(in_stack_fffffffffffff4a8,(QStringList *)v,(char *)this_00);
  ch = XmlOutput::operator<<(in_stack_fffffffffffff440,in_stack_fffffffffffff438);
  ::toString((midlCharOption)((ulong)this_00 >> 0x20));
  attrTagS((char *)this_00,(QString *)this_02);
  XmlOutput::operator<<(in_stack_fffffffffffff440,in_stack_fffffffffffff438);
  attrTagS((char *)this_00,(QString *)this_02);
  o = XmlOutput::operator<<(in_stack_fffffffffffff440,in_stack_fffffffffffff438);
  ::toString((midlErrorCheckOption)((ulong)this_00 >> 0x20));
  attrTagS((char *)this_00,(QString *)this_02);
  this_01 = XmlOutput::operator<<(in_stack_fffffffffffff440,(xml_output *)o);
  attrTagT((char *)v,(triState)((ulong)this_00 >> 0x20));
  XmlOutput::operator<<(this_01,(xml_output *)o);
  attrTagT((char *)v,(triState)((ulong)this_00 >> 0x20));
  XmlOutput::operator<<(this_01,(xml_output *)o);
  attrTagT((char *)v,(triState)((ulong)this_00 >> 0x20));
  XmlOutput::operator<<(this_01,(xml_output *)o);
  attrTagT((char *)v,(triState)((ulong)this_00 >> 0x20));
  XmlOutput::operator<<(this_01,(xml_output *)o);
  attrTagT((char *)v,(triState)((ulong)this_00 >> 0x20));
  XmlOutput::operator<<(this_01,(xml_output *)o);
  attrTagS((char *)this_00,(QString *)this_02);
  XmlOutput::operator<<(this_01,(xml_output *)o);
  attrTagS((char *)this_00,(QString *)this_02);
  XmlOutput::operator<<(this_01,(xml_output *)o);
  attrTagT((char *)v,(triState)((ulong)this_00 >> 0x20));
  XmlOutput::operator<<(this_01,(xml_output *)o);
  attrTagT((char *)v,(triState)((ulong)this_00 >> 0x20));
  XmlOutput::operator<<(this_01,(xml_output *)o);
  attrTagS((char *)this_00,(QString *)this_02);
  XmlOutput::operator<<(this_01,(xml_output *)o);
  attrTagT((char *)v,(triState)((ulong)this_00 >> 0x20));
  XmlOutput::operator<<(this_01,(xml_output *)o);
  attrTagS((char *)this_00,(QString *)this_02);
  XmlOutput::operator<<(this_01,(xml_output *)o);
  attrTagL((char *)v,(qint64)this_00,(qint64)this_02);
  name = XmlOutput::operator<<(this_01,(xml_output *)o);
  attrTagT((char *)v,(triState)((ulong)this_00 >> 0x20));
  XmlOutput::operator<<(this_01,(xml_output *)o);
  attrTagS((char *)this_00,(QString *)this_02);
  XmlOutput::operator<<(this_01,(xml_output *)o);
  attrTagX((char *)name,(QStringList *)v,(char *)this_00);
  XmlOutput::operator<<(this_01,(xml_output *)o);
  attrTagS((char *)this_00,(QString *)this_02);
  XmlOutput::operator<<(this_01,(xml_output *)o);
  attrTagS((char *)this_00,(QString *)this_02);
  XmlOutput::operator<<(this_01,(xml_output *)o);
  attrTagS((char *)this_00,(QString *)this_02);
  XmlOutput::operator<<(this_01,(xml_output *)o);
  ::toString((midlStructMemberAlignOption)((ulong)this_00 >> 0x20));
  attrTagS((char *)this_00,(QString *)this_02);
  XmlOutput::operator<<(this_01,(xml_output *)o);
  attrTagT((char *)v,(triState)((ulong)this_00 >> 0x20));
  XmlOutput::operator<<(this_01,(xml_output *)o);
  attrTagT((char *)v,(triState)((ulong)this_00 >> 0x20));
  XmlOutput::operator<<(this_01,(xml_output *)o);
  ::toString((midlTargetEnvironment)((ulong)this_00 >> 0x20));
  attrTagS((char *)this_00,(QString *)this_02);
  XmlOutput::operator<<(this_01,(xml_output *)o);
  attrTagS((char *)this_00,(QString *)this_02);
  XmlOutput::operator<<(this_01,(xml_output *)o);
  attrTagS((char *)this_00,(QString *)this_02);
  XmlOutput::operator<<(this_01,(xml_output *)o);
  attrTagX((char *)name,(QStringList *)v,(char *)this_00);
  XmlOutput::operator<<(this_01,(xml_output *)o);
  attrTagT((char *)v,(triState)((ulong)this_00 >> 0x20));
  XmlOutput::operator<<(this_01,(xml_output *)o);
  attrTagT((char *)v,(triState)((ulong)this_00 >> 0x20));
  XmlOutput::operator<<(this_01,(xml_output *)o);
  ::toString((midlWarningLevelOption)((ulong)this_00 >> 0x20));
  attrTagS((char *)this_00,(QString *)this_02);
  XmlOutput::operator<<(this_01,(xml_output *)o);
  QString::QString((QString *)this_00,(char *)ch);
  closetag((QString *)toTag);
  XmlOutput::operator<<(this_01,(xml_output *)o);
  XmlOutput::xml_output::~xml_output(this_02);
  QString::~QString((QString *)0x247bb9);
  XmlOutput::xml_output::~xml_output(this_02);
  QString::~QString((QString *)0x247bd3);
  XmlOutput::xml_output::~xml_output(this_02);
  XmlOutput::xml_output::~xml_output(this_02);
  XmlOutput::xml_output::~xml_output(this_02);
  XmlOutput::xml_output::~xml_output(this_02);
  XmlOutput::xml_output::~xml_output(this_02);
  XmlOutput::xml_output::~xml_output(this_02);
  QString::~QString((QString *)0x247c2e);
  XmlOutput::xml_output::~xml_output(this_02);
  XmlOutput::xml_output::~xml_output(this_02);
  XmlOutput::xml_output::~xml_output(this_02);
  QString::~QString((QString *)0x247c62);
  XmlOutput::xml_output::~xml_output(this_02);
  XmlOutput::xml_output::~xml_output(this_02);
  XmlOutput::xml_output::~xml_output(this_02);
  XmlOutput::xml_output::~xml_output(this_02);
  XmlOutput::xml_output::~xml_output(this_02);
  XmlOutput::xml_output::~xml_output(this_02);
  XmlOutput::xml_output::~xml_output(this_02);
  XmlOutput::xml_output::~xml_output(this_02);
  XmlOutput::xml_output::~xml_output(this_02);
  XmlOutput::xml_output::~xml_output(this_02);
  XmlOutput::xml_output::~xml_output(this_02);
  XmlOutput::xml_output::~xml_output(this_02);
  XmlOutput::xml_output::~xml_output(this_02);
  XmlOutput::xml_output::~xml_output(this_02);
  XmlOutput::xml_output::~xml_output(this_02);
  XmlOutput::xml_output::~xml_output(this_02);
  XmlOutput::xml_output::~xml_output(this_02);
  XmlOutput::xml_output::~xml_output(this_02);
  XmlOutput::xml_output::~xml_output(this_02);
  XmlOutput::xml_output::~xml_output(this_02);
  QString::~QString((QString *)0x247d73);
  XmlOutput::xml_output::~xml_output(this_02);
  XmlOutput::xml_output::~xml_output(this_02);
  QString::~QString((QString *)0x247d9a);
  XmlOutput::xml_output::~xml_output(this_02);
  XmlOutput::xml_output::~xml_output(this_02);
  XmlOutput::xml_output::~xml_output(this_02);
  XmlOutput::xml_output::~xml_output(this_02);
  XmlOutput::xml_output::~xml_output(this_02);
  XmlOutput::xml_output::~xml_output(this_02);
  QString::~QString((QString *)0x247df5);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void VCXProjectWriter::write(XmlOutput &xml, const VCMIDLTool &tool)
{
    xml
        << tag(_Midl)
            << attrTagX(_AdditionalIncludeDirectories, tool.AdditionalIncludeDirectories, ";")
            << attrTagX(_AdditionalOptions, tool.AdditionalOptions, " ")
            << attrTagT(_ApplicationConfigurationMode, tool.ApplicationConfigurationMode)
            << attrTagS(_ClientStubFile, tool.ClientStubFile)
            << attrTagX(_CPreprocessOptions, tool.CPreprocessOptions, " ")
            << attrTagS(_DefaultCharType, toString(tool.DefaultCharType))
            << attrTagS(_DLLDataFileName, tool.DLLDataFileName)
            << attrTagS(_EnableErrorChecks, toString(tool.EnableErrorChecks))
            << attrTagT(_ErrorCheckAllocations, tool.ErrorCheckAllocations)
            << attrTagT(_ErrorCheckBounds, tool.ErrorCheckBounds)
            << attrTagT(_ErrorCheckEnumRange, tool.ErrorCheckEnumRange)
            << attrTagT(_ErrorCheckRefPointers, tool.ErrorCheckRefPointers)
            << attrTagT(_ErrorCheckStubData, tool.ErrorCheckStubData)
            << attrTagS(_GenerateClientFiles, tool.GenerateClientFiles)
            << attrTagS(_GenerateServerFiles, tool.GenerateServerFiles)
            << attrTagT(_GenerateStublessProxies, tool.GenerateStublessProxies)
            << attrTagT(_GenerateTypeLibrary, tool.GenerateTypeLibrary)
            << attrTagS(_HeaderFileName, tool.HeaderFileName)
            << attrTagT(_IgnoreStandardIncludePath, tool.IgnoreStandardIncludePath)
            << attrTagS(_InterfaceIdentifierFileName, tool.InterfaceIdentifierFileName)
            << attrTagL(_LocaleID, tool.LocaleID, /*ifNot*/ -1)
            << attrTagT(_MkTypLibCompatible, tool.MkTypLibCompatible)
            << attrTagS(_OutputDirectory, tool.OutputDirectory)
            << attrTagX(_PreprocessorDefinitions, tool.PreprocessorDefinitions, ";")
            << attrTagS(_ProxyFileName, tool.ProxyFileName)
            << attrTagS(_RedirectOutputAndErrors, tool.RedirectOutputAndErrors)
            << attrTagS(_ServerStubFile, tool.ServerStubFile)
            << attrTagS(_StructMemberAlignment, toString(tool.StructMemberAlignment))
            << attrTagT(_SuppressCompilerWarnings, tool.SuppressCompilerWarnings)
            << attrTagT(_SuppressStartupBanner, tool.SuppressStartupBanner)
            << attrTagS(_TargetEnvironment, toString(tool.TargetEnvironment))
            << attrTagS(_TypeLibFormat, tool.TypeLibFormat)
            << attrTagS(_TypeLibraryName, tool.TypeLibraryName)
            << attrTagX(_UndefinePreprocessorDefinitions, tool.UndefinePreprocessorDefinitions, ";")
            << attrTagT(_ValidateAllParameters, tool.ValidateAllParameters)
            << attrTagT(_WarnAsError, tool.WarnAsError)
            << attrTagS(_WarningLevel, toString(tool.WarningLevel))
        << closetag(_Midl);
}